

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

DOHcode rdata(uchar *doh,size_t dohlen,unsigned_short rdlength,unsigned_short type,int index,
             dohentry *d)

{
  anon_union_16_2_f9ece763_for_ip *paVar1;
  byte bVar2;
  undefined8 uVar3;
  uint uVar4;
  DOHcode DVar5;
  DOHcode DVar6;
  int iVar7;
  undefined6 in_register_0000000a;
  long lVar8;
  DOHcode DVar9;
  cnamestore *c;
  uint uVar10;
  bool bVar11;
  
  iVar7 = (int)CONCAT62(in_register_0000000a,type);
  if (iVar7 == 0x1c) {
    if (rdlength != 0x10) {
      return DOH_DNS_RDATA_LEN;
    }
    lVar8 = (long)d->numaddr;
    if (0x17 < lVar8) {
      return DOH_OK;
    }
    d->addr[lVar8].type = 0x1c;
    uVar3 = *(undefined8 *)(doh + index + 8);
    paVar1 = &d->addr[lVar8].ip;
    *(undefined8 *)paVar1 = *(undefined8 *)(doh + index);
    *(undefined8 *)((long)paVar1 + 8) = uVar3;
    iVar7 = d->numaddr;
  }
  else {
    if (iVar7 == 5) {
      iVar7 = d->numcname;
      DVar9 = DOH_OK;
      DVar5 = DOH_OK;
      if ((long)iVar7 != 4) {
        d->numcname = iVar7 + 1;
        c = d->cname + iVar7;
        iVar7 = -0x7f;
        do {
          if (dohlen <= (uint)index) {
            DVar5 = DOH_DNS_OUT_OF_RANGE;
            goto LAB_00497a32;
          }
          bVar2 = doh[(uint)index];
          uVar10 = (uint)bVar2;
          if ((bVar2 & 0xc0) == 0) {
            index = index + 1;
            if (bVar2 != 0) {
              uVar4 = index;
              if ((c->len == 0) || (DVar5 = cnameappend(c,".",1), DVar5 == DOH_OK)) {
                if (dohlen < index + uVar10) {
                  bVar11 = false;
                  DVar5 = DOH_DNS_BAD_LABEL;
                }
                else {
                  DVar6 = cnameappend(c,doh + (uint)index,(ulong)uVar10);
                  bVar11 = DVar6 == DOH_OK;
                  uVar4 = index + uVar10;
                  DVar5 = DVar9;
                  if (!bVar11) {
                    uVar4 = index;
                    DVar5 = DVar6;
                  }
                }
              }
              else {
                bVar11 = false;
              }
              index = uVar4;
              DVar9 = DVar5;
              if (!bVar11) goto LAB_00497a32;
            }
          }
          else {
            if ((uVar10 & 0xc0) != 0xc0) {
              DVar5 = DOH_DNS_BAD_LABEL;
              goto LAB_00497a32;
            }
            DVar5 = DOH_DNS_OUT_OF_RANGE;
            if (dohlen <= index + 1) goto LAB_00497a32;
            index = (uint)doh[index + 1] | (uVar10 & 0x3f) << 8;
          }
        } while ((bVar2 != 0) && (bVar11 = iVar7 != 0, iVar7 = iVar7 + 1, bVar11));
        DVar5 = (uint)(bVar2 != 0) * 3;
      }
LAB_00497a32:
      if (DVar5 == DOH_OK) {
        return DOH_OK;
      }
      return DVar5;
    }
    if (iVar7 != 1) {
      return DOH_OK;
    }
    if (rdlength != 4) {
      return DOH_DNS_RDATA_LEN;
    }
    iVar7 = d->numaddr;
    lVar8 = (long)iVar7;
    if (0x17 < lVar8) {
      return DOH_OK;
    }
    d->addr[lVar8].type = 1;
    *(undefined4 *)&d->addr[lVar8].ip = *(undefined4 *)(doh + index);
  }
  d->numaddr = iVar7 + 1;
  return DOH_OK;
}

Assistant:

static DOHcode rdata(unsigned char *doh,
                     size_t dohlen,
                     unsigned short rdlength,
                     unsigned short type,
                     int index,
                     struct dohentry *d)
{
  /* RDATA
     - A (TYPE 1):  4 bytes
     - AAAA (TYPE 28): 16 bytes
     - NS (TYPE 2): N bytes */
  DOHcode rc;

  switch(type) {
  case DNS_TYPE_A:
    if(rdlength != 4)
      return DOH_DNS_RDATA_LEN;
    rc = store_a(doh, index, d);
    if(rc)
      return rc;
    break;
  case DNS_TYPE_AAAA:
    if(rdlength != 16)
      return DOH_DNS_RDATA_LEN;
    rc = store_aaaa(doh, index, d);
    if(rc)
      return rc;
    break;
  case DNS_TYPE_CNAME:
    rc = store_cname(doh, dohlen, index, d);
    if(rc)
      return rc;
    break;
  default:
    /* unsupported type, just skip it */
    break;
  }
  return DOH_OK;
}